

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineFactoryVk.cpp
# Opt level: O0

void __thiscall
Diligent::anon_unknown_0::EngineFactoryVkImpl::CreateSwapChainVk
          (EngineFactoryVkImpl *this,IRenderDevice *pDevice,IDeviceContext *pImmediateContext,
          SwapChainDesc *SCDesc,NativeWindow *Window,ISwapChain **ppSwapChain)

{
  Char *Message;
  runtime_error *anon_var_0;
  SwapChainVkImpl *local_88;
  SwapChainVkImpl *pSwapChainVk;
  IMemoryAllocator *RawMemAllocator;
  DeviceContextVkImpl *pDeviceContextVk;
  RenderDeviceVkImpl *pDeviceVk;
  undefined1 local_58 [8];
  string msg;
  ISwapChain **ppSwapChain_local;
  NativeWindow *Window_local;
  SwapChainDesc *SCDesc_local;
  IDeviceContext *pImmediateContext_local;
  IRenderDevice *pDevice_local;
  EngineFactoryVkImpl *this_local;
  
  msg.field_2._8_8_ = ppSwapChain;
  if (ppSwapChain == (ISwapChain **)0x0) {
    FormatString<char[22]>((string *)local_58,(char (*) [22])"Null pointer provided");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"CreateSwapChainVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/EngineFactoryVk.cpp"
               ,0x5cb);
    std::__cxx11::string::~string((string *)local_58);
  }
  if (msg.field_2._8_8_ != 0) {
    *(undefined8 *)msg.field_2._8_8_ = 0;
    pDeviceContextVk =
         (DeviceContextVkImpl *)
         ClassPtrCast<Diligent::RenderDeviceVkImpl,Diligent::IRenderDevice>(pDevice);
    RawMemAllocator =
         (IMemoryAllocator *)
         ClassPtrCast<Diligent::DeviceContextVkImpl,Diligent::IDeviceContext>(pImmediateContext);
    pSwapChainVk = (SwapChainVkImpl *)GetRawAllocator();
    MakeNewRCObj<Diligent::SwapChainVkImpl,_Diligent::IMemoryAllocator>::MakeNewRCObj
              ((MakeNewRCObj<Diligent::SwapChainVkImpl,_Diligent::IMemoryAllocator> *)&anon_var_0,
               (IMemoryAllocator *)pSwapChainVk,"SwapChainVkImpl instance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/EngineFactoryVk.cpp"
               ,0x5d7,(IObject *)0x0);
    local_88 = MakeNewRCObj<Diligent::SwapChainVkImpl,Diligent::IMemoryAllocator>::operator()
                         ((MakeNewRCObj<Diligent::SwapChainVkImpl,Diligent::IMemoryAllocator> *)
                          &anon_var_0,SCDesc,(RenderDeviceVkImpl **)&pDeviceContextVk,
                          (DeviceContextVkImpl **)&RawMemAllocator,Window);
    SwapChainVkImpl::QueryInterface
              (local_88,(INTERFACE_ID *)IID_SwapChain,(IObject **)msg.field_2._8_8_);
  }
  return;
}

Assistant:

void EngineFactoryVkImpl::CreateSwapChainVk(IRenderDevice*       pDevice,
                                            IDeviceContext*      pImmediateContext,
                                            const SwapChainDesc& SCDesc,
                                            const NativeWindow&  Window,
                                            ISwapChain**         ppSwapChain)
{
    DEV_CHECK_ERR(ppSwapChain, "Null pointer provided");
    if (!ppSwapChain)
        return;

    *ppSwapChain = nullptr;

    try
    {
        RenderDeviceVkImpl*  pDeviceVk        = ClassPtrCast<RenderDeviceVkImpl>(pDevice);
        DeviceContextVkImpl* pDeviceContextVk = ClassPtrCast<DeviceContextVkImpl>(pImmediateContext);
        IMemoryAllocator&    RawMemAllocator  = GetRawAllocator();

        SwapChainVkImpl* pSwapChainVk = NEW_RC_OBJ(RawMemAllocator, "SwapChainVkImpl instance", SwapChainVkImpl)(SCDesc, pDeviceVk, pDeviceContextVk, Window);
        pSwapChainVk->QueryInterface(IID_SwapChain, reinterpret_cast<IObject**>(ppSwapChain));
    }
    catch (const std::runtime_error&)
    {
        if (*ppSwapChain)
        {
            (*ppSwapChain)->Release();
            *ppSwapChain = nullptr;
        }

        LOG_ERROR("Failed to create the swap chain");
    }
}